

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O3

char * zt_cstr_catv(char *s,...)

{
  char *pcVar1;
  char in_AL;
  uint uVar2;
  size_t sVar3;
  long lVar4;
  char *pcVar5;
  ulong uVar6;
  undefined8 in_RCX;
  long lVar7;
  void **ppvVar8;
  undefined8 in_RDX;
  size_t sVar9;
  int iVar10;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  uint uVar11;
  void **ppvVar12;
  long lVar13;
  long lVar14;
  size_t num;
  char *pcVar15;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  uint local_118;
  void **local_110;
  long local_f8;
  void *local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  ppvVar8 = &ap[0].overflow_arg_area;
  local_e8[1] = (void *)in_RSI;
  local_e8[2] = (void *)in_RDX;
  local_e8[3] = (void *)in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  if (s == (char *)0x0) {
    num = 1;
  }
  else {
    local_118 = 8;
    lVar14 = 0;
    pcVar15 = s;
    do {
      if (local_118 < 0x29) {
        uVar11 = local_118 + 8;
        iVar10 = *(int *)((long)local_e8 + (ulong)local_118);
        local_f8 = (long)iVar10;
        if (0x20 < local_118) goto LAB_00104e3b;
        uVar6 = (ulong)uVar11;
        uVar11 = local_118 + 0x10;
        ppvVar12 = ppvVar8;
        ppvVar8 = (void **)((long)local_e8 + uVar6);
      }
      else {
        iVar10 = *(int *)ppvVar8;
        local_f8 = (long)iVar10;
        ppvVar8 = ppvVar8 + 1;
        uVar11 = local_118;
LAB_00104e3b:
        ppvVar12 = ppvVar8 + 1;
      }
      sVar3 = strlen(pcVar15);
      if (sVar3 == 0) {
        lVar7 = 0;
      }
      else {
        sVar9 = 0;
        if (iVar10 < 0) {
          sVar9 = sVar3;
        }
        lVar13 = sVar9 + local_f8;
        if ((long)sVar3 <= (long)(sVar9 + local_f8)) {
          lVar13 = sVar3 - 1;
        }
        lVar7 = ((long)*(int *)ppvVar8 >> 0x3f & sVar3) + (long)*(int *)ppvVar8;
        if ((long)sVar3 <= lVar7) {
          lVar7 = sVar3 - 1;
        }
        lVar4 = lVar7;
        if (lVar7 < lVar13) {
          lVar4 = lVar13;
        }
        if (lVar13 < lVar7) {
          lVar7 = lVar13;
        }
        lVar7 = lVar7 - lVar4;
      }
      lVar13 = -lVar7;
      if (0 < lVar7) {
        lVar13 = lVar7;
      }
      if (uVar11 < 0x29) {
        ppvVar8 = ppvVar12;
        ppvVar12 = (void **)((long)local_e8 + (ulong)uVar11);
        local_118 = uVar11 + 8;
      }
      else {
        ppvVar8 = ppvVar12 + 1;
        local_118 = uVar11;
      }
      lVar13 = lVar14 + lVar13;
      lVar14 = lVar13 + 2;
      pcVar15 = (char *)*ppvVar12;
    } while (pcVar15 != (char *)0x0);
    num = lVar13 + 3;
  }
  local_110 = &ap[0].overflow_arg_area;
  pcVar5 = (char *)zt_malloc_p(num);
  uVar11 = 8;
  pcVar15 = pcVar5;
  if (s != (char *)0x0) {
    uVar6 = 8;
    pcVar1 = pcVar5;
    do {
      pcVar15 = pcVar1;
      uVar2 = (uint)uVar6;
      if (uVar2 < 0x29) {
        uVar11 = uVar2 + 8;
        iVar10 = *(int *)((long)local_e8 + uVar6);
        lVar14 = (long)iVar10;
        if (0x20 < uVar2) goto LAB_00104f70;
        uVar6 = (ulong)uVar11;
        uVar11 = uVar2 + 0x10;
        ppvVar8 = (void **)((long)local_e8 + uVar6);
      }
      else {
        iVar10 = *(int *)local_110;
        lVar14 = (long)iVar10;
        local_110 = local_110 + 1;
LAB_00104f70:
        ppvVar8 = local_110;
        local_110 = local_110 + 1;
      }
      sVar3 = strlen(s);
      if (sVar3 == 0) {
        lVar14 = 0;
        lVar7 = 0;
      }
      else {
        sVar9 = 0;
        if (iVar10 < 0) {
          sVar9 = sVar3;
        }
        lVar13 = sVar9 + lVar14;
        if ((long)sVar3 <= (long)(sVar9 + lVar14)) {
          lVar13 = sVar3 - 1;
        }
        lVar7 = ((long)*(int *)ppvVar8 >> 0x3f & sVar3) + (long)*(int *)ppvVar8;
        if ((long)sVar3 <= lVar7) {
          lVar7 = sVar3 - 1;
        }
        lVar14 = lVar7;
        if (lVar7 < lVar13) {
          lVar14 = lVar13;
        }
        if (lVar13 < lVar7) {
          lVar7 = lVar13;
        }
      }
      lVar13 = 0;
      do {
        pcVar15[lVar13] = s[lVar13 + lVar7];
        lVar13 = lVar13 + 1;
      } while ((lVar14 - lVar7) + 1 != lVar13);
      uVar6 = (ulong)uVar11;
      if (uVar6 < 0x29) {
        ppvVar8 = (void **)((long)local_e8 + uVar6);
        uVar11 = uVar11 + 8;
        uVar6 = (ulong)uVar11;
      }
      else {
        ppvVar8 = local_110;
        local_110 = local_110 + 1;
      }
      s = (char *)*ppvVar8;
      pcVar1 = pcVar15 + lVar13;
    } while (s != (char *)0x0);
    pcVar15 = pcVar15 + lVar13;
  }
  *pcVar15 = '\0';
  return pcVar5;
}

Assistant:

char *
zt_cstr_catv(const char *s, ...) {
    char       * new;
    char       * p;
    const char * save = s;
    ssize_t      i;
    ssize_t      j;
    size_t       len  = 0;
    va_list      ap;

    va_start(ap, s);

    /* calculate the lentgh */
    while (s) {
        i    = va_arg(ap, int);
        j    = va_arg(ap, int);
        CONVERT(s, i, j);
        len += IDXLEN(i, j) + 1;
        s    = va_arg(ap, const char *);
    }

    va_end(ap);

    p = new = zt_malloc(char, len + 1);
    s = save;
    va_start(ap, s);

    while (s) {
        i = va_arg(ap, int);
        j = va_arg(ap, int);
        CONVERT(s, i, j);

        while (i <= j) {
            *p++ = s[i++];
        }
        s = va_arg(ap, const char *);
    }

    *p = '\0';
    return new;
}